

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_GT_Test::Body(iu_SyntaxTest_x_iutest_x_GT_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, GT)
{
    if( int x = 1 )
        IUTEST_ASSERT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GT(2, x) << x;
}